

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_writeStream
              (SoapySDRDevice *device,SoapySDRStream *stream,void **buffs,size_t numElems,int *flags
              ,longlong timeNs,long timeoutUs)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  exception *ex;
  
  SoapySDRDevice_clearError();
  iVar1 = (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
  return iVar1;
}

Assistant:

int SoapySDRDevice_writeStream(SoapySDRDevice *device, SoapySDRStream *stream, const void * const *buffs, const size_t numElems, int *flags, const long long timeNs, const long timeoutUs)
{
    __SOAPY_SDR_C_TRY
    return device->writeStream(reinterpret_cast<SoapySDR::Stream *>(stream), buffs, numElems, *flags, timeNs, timeoutUs);
    __SOAPY_SDR_C_CATCH_RET(SOAPY_SDR_STREAM_ERROR);
}